

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int js_typed_array_get_length_internal(JSContext *ctx,JSValue obj)

{
  JSValueUnion JVar1;
  
  JVar1 = obj.u;
  if (((int)obj.tag == -1) && ((ushort)(*(short *)((long)JVar1.ptr + 6) - 0x15U) < 9)) {
    if (*(char *)(*(long *)(*(long *)(*(long *)((long)JVar1.ptr + 0x30) + 0x18) + 0x30) + 4) == '\0'
       ) {
      return *(int *)((long)JVar1.ptr + 0x40);
    }
    JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
  }
  else {
    JS_ThrowTypeError(ctx,"not a %s","TypedArray");
  }
  return -1;
}

Assistant:

static int js_typed_array_get_length_internal(JSContext *ctx,
                                              JSValueConst obj)
{
    JSObject *p;
    p = get_typed_array(ctx, obj, 0);
    if (!p)
        return -1;
    if (typed_array_is_detached(ctx, p)) {
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        return -1;
    }
    return p->u.array.count;
}